

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O3

Bool prvTidytidySetLanguage(ctmbstr languageCode)

{
  int iVar1;
  ulong in_RAX;
  tmbstr ptVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  languageDefinition *plVar5;
  languageDefinition *plVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  tidyLocaleMapItemImpl *ptVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uStack_38;
  bool bVar14;
  
  if (languageCode == (ctmbstr)0x0) {
    return no;
  }
  uStack_38 = in_RAX;
  ptVar2 = prvTidytmbstrdup(&prvTidyg_default_allocator,languageCode);
  ptVar2 = prvTidytmbstrtolower(ptVar2);
  iVar1 = strcmp("america",ptVar2);
  if (iVar1 == 0) {
    ptVar10 = localeMappings;
  }
  else {
    uVar9 = 1;
    do {
      uVar7 = uVar9;
      if (localeMappings[uVar7].winName == (char *)0x0) goto LAB_00154d01;
      iVar1 = strcmp(localeMappings[uVar7].winName,ptVar2);
      uVar9 = uVar7 + 1;
    } while (iVar1 != 0);
    ptVar10 = localeMappings + uVar7;
  }
  (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,ptVar2);
  ptVar2 = prvTidytmbstrdup(&prvTidyg_default_allocator,ptVar10->POSIXName);
LAB_00154d01:
  sVar3 = strlen(ptVar2);
  uVar9 = (uint)sVar3;
  if (uVar9 != 0) {
    uVar11 = 5;
    if (uVar9 < 5) {
      uVar11 = sVar3 & 0xffffffff;
    }
    uVar8 = 0;
    do {
      if (uVar8 == 2) {
        if (uVar9 < 5) {
          DAT_001f9f12 = 0;
          break;
        }
        DAT_001f9f12 = 0x5f;
      }
      else {
        pp_Var4 = __ctype_tolower_loc();
        (&prvTidytidyNormalizedLocaleName_result)[uVar8] = (char)(*pp_Var4)[ptVar2[uVar8]];
      }
      uVar8 = uVar8 + 1;
    } while (uVar11 != uVar8);
  }
  (*(prvTidyg_default_allocator.vtbl)->free)(&prvTidyg_default_allocator,ptVar2);
  plVar5 = prvTidytidyTestLanguage(&prvTidytidyNormalizedLocaleName_result);
  sVar3 = strlen(&prvTidytidyNormalizedLocaleName_result);
  if (sVar3 < 3) {
    bVar12 = false;
    plVar6 = (languageDefinition *)0x0;
LAB_00154df4:
    bVar14 = plVar5 != (languageDefinition *)0x0;
    bVar13 = plVar5 == (languageDefinition *)0x0;
    if (bVar13 || bVar12 != false) goto LAB_00154e06;
  }
  else {
    strncpy((char *)((long)&uStack_38 + 5),&prvTidytidyNormalizedLocaleName_result,2);
    uStack_38 = uStack_38 & 0xffffffffffffff;
    plVar6 = prvTidytidyTestLanguage((char *)((long)&uStack_38 + 5));
    bVar12 = plVar6 != (languageDefinition *)0x0;
    if (plVar5 == (languageDefinition *)0x0 || !bVar12) goto LAB_00154df4;
    bVar14 = true;
    bVar13 = false;
    bVar12 = true;
    tidyLanguages.currentLanguage = plVar5;
    tidyLanguages.fallbackLanguage = plVar6;
LAB_00154e06:
    plVar5 = plVar6;
    if (!(bool)(bVar13 & bVar12)) goto LAB_00154e24;
  }
  tidyLanguages.fallbackLanguage = (languageDefinition *)0x0;
  tidyLanguages.currentLanguage = plVar5;
LAB_00154e24:
  return (uint)(byte)(bVar14 | bVar12);
}

Assistant:

TY_PRIVATE Bool TY_(tidySetLanguage)( ctmbstr languageCode )
{
    languageDefinition *dict1 = NULL;
    languageDefinition *dict2 = NULL;
    tmbstr wantCode = NULL;
    char lang[3] = "";
    
    if ( !languageCode || !(wantCode = TY_(tidyNormalizedLocaleName)( languageCode )) )
    {
        return no;
    }
    
    /* We want to use the specified language as the currentLanguage, and set
     fallback language as necessary. We have either a two or five digit code,
     either or both of which might be installed. Let's test both of them:
     */
    
    dict1 = TY_(tidyTestLanguage( wantCode ));  /* WANTED language */
    
    if ( strlen( wantCode ) > 2 )
    {
        strncpy(lang, wantCode, 2);
        lang[2] = '\0';
        dict2 = TY_(tidyTestLanguage( lang ) ); /* BACKUP language? */
    }
    
    if ( dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = dict2;
    }
    if ( dict1 && !dict2 )
    {
        tidyLanguages.currentLanguage = dict1;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && dict2 )
    {
        tidyLanguages.currentLanguage = dict2;
        tidyLanguages.fallbackLanguage = NULL;
    }
    if ( !dict1 && !dict2 )
    {
        /* No change. */
    }
    
    return dict1 || dict2;
}